

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void pdf_array_push(hd_context *ctx,pdf_obj *obj,pdf_obj *item)

{
  char *pcVar1;
  pdf_obj *ppVar2;
  pdf_obj *local_20;
  pdf_obj *item_local;
  pdf_obj *obj_local;
  hd_context *ctx_local;
  
  item_local = obj;
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'r')) {
    item_local = pdf_resolve_indirect_chain(ctx,obj);
  }
  if (((pdf_obj *)0x188 < item_local) && (item_local->kind == 'a')) {
    local_20 = item;
    if (item == (pdf_obj *)0x0) {
      local_20 = (pdf_obj *)0x188;
    }
    prepare_object_for_alteration(ctx,item_local,local_20);
    if ((int)item_local[6] < (int)item_local[5] + 1) {
      pdf_array_grow(ctx,(pdf_obj_array *)item_local);
    }
    ppVar2 = pdf_keep_obj(ctx,local_20);
    *(pdf_obj **)(*(long *)(item_local + 8) + (long)(int)item_local[5] * 8) = ppVar2;
    item_local[5] = (pdf_obj)((int)item_local[5] + 1);
    return;
  }
  pcVar1 = pdf_objkindstr(item_local);
  hd_throw(ctx,2,"not an array (%s)",pcVar1);
}

Assistant:

void
pdf_array_push(hd_context *ctx, pdf_obj *obj, pdf_obj *item)
{
    RESOLVE(obj);
    if (!OBJ_IS_ARRAY(obj))
        hd_throw(ctx, HD_ERROR_GENERIC, "not an array (%s)", pdf_objkindstr(obj));

    if (!item)
        item = PDF_OBJ_NULL;

    prepare_object_for_alteration(ctx, obj, item);
    if (ARRAY(obj)->len + 1 > ARRAY(obj)->cap)
        pdf_array_grow(ctx, ARRAY(obj));
    ARRAY(obj)->items[ARRAY(obj)->len] = pdf_keep_obj(ctx, item);
    ARRAY(obj)->len++;
}